

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstrumentPass::InstrumentFunction
          (InstrumentPass *this,Function *func,uint32_t stage_idx,InstProcessFunction *pfn)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  Instruction *pIVar4;
  size_type sVar5;
  type pBVar6;
  mapped_type *ppBVar7;
  pointer pBVar8;
  undefined1 local_128 [16];
  size_t i;
  Instruction *local_108;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *bb;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *__range4_1;
  size_t newBlocksSize;
  pointer local_c8;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *blk;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *__range4;
  iterator local_98;
  Instruction *local_90;
  UptrVector *local_88;
  iterator local_80;
  undefined1 local_78 [16];
  iterator ii;
  undefined1 local_58 [8];
  iterator bi;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  new_blks;
  bool modified;
  bool first_block_split;
  InstProcessFunction *pfn_local;
  uint32_t stage_idx_local;
  Function *func_local;
  InstrumentPass *this_local;
  
  this->curr_func_ = func;
  std::
  unordered_map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int,_spvtools::opt::InstrumentPass::vector_hash_,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
  ::clear(&this->call2id_);
  bVar1 = false;
  new_blks.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = false;
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::vector((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            *)&bi.iterator_);
  _local_58 = Function::begin(func);
  do {
    _ii = Function::end(func);
    bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&ii);
    if (!bVar2) {
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ::~vector((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 *)&bi.iterator_);
      return new_blks.
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_;
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58);
    BasicBlock::begin((BasicBlock *)(local_78 + 8));
    while( true ) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58);
      BasicBlock::end((BasicBlock *)local_78);
      bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_78 + 8),
                                (iterator_template<spvtools::opt::Instruction> *)local_78);
      if (!bVar2) break;
      if (((this->opt_direct_reads_ & 1U) == 0) || (bVar1)) {
        InstructionList::iterator::iterator(&local_98,(iterator *)(local_78 + 8));
        std::
        function<void_(spvtools::opt::InstructionList::iterator,_spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,_false>,_unsigned_int,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_*)>
        ::operator()(pfn,&local_98,_local_58,stage_idx,
                     (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      *)&bi.iterator_);
      }
      else {
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)(local_78 + 8));
        OVar3 = Instruction::opcode(pIVar4);
        if (OVar3 != OpVariable) {
          InstructionList::iterator::iterator(&local_80,(iterator *)(local_78 + 8));
          local_90 = (Instruction *)local_58;
          local_88 = bi.container_;
          SplitBlock(this,&local_80,_local_58,
                     (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      *)&bi.iterator_);
          bVar1 = true;
        }
      }
      sVar5 = std::
              vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              ::size((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      *)&bi.iterator_);
      if (sVar5 == 0) {
        InstructionList::iterator::operator++((iterator *)(local_78 + 8));
      }
      else {
        __end4 = std::
                 vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ::begin((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          *)&bi.iterator_);
        blk = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)std::
                 vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ::end((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        *)&bi.iterator_);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                                           *)&blk), bVar2) {
          local_c8 = (pointer)__gnu_cxx::
                              __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                              ::operator*(&__end4);
          pBVar6 = std::
                   unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ::operator*((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                *)local_c8);
          pBVar8 = std::
                   unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ::operator->((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                 *)local_c8);
          newBlocksSize._4_4_ = BasicBlock::id(pBVar8);
          ppBVar7 = std::
                    unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
                    ::operator[](&this->id2block_,(key_type *)((long)&newBlocksSize + 4));
          *ppBVar7 = pBVar6;
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
          ::operator++(&__end4);
        }
        sVar5 = std::
                vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ::size((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        *)&bi.iterator_);
        if (sVar5 < 2) {
          __assert_fail("newBlocksSize > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                        ,0x262,
                        "virtual bool spvtools::opt::InstrumentPass::InstrumentFunction(Function *, uint32_t, InstProcessFunction &)"
                       );
        }
        UpdateSucceedingPhis
                  (this,(vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                         *)&bi.iterator_);
        _local_58 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::Erase<false>
                              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58);
        __end4_1 = std::
                   vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ::begin((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                            *)&bi.iterator_);
        bb = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)std::
                vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ::end((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       *)&bi.iterator_);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                                   *)&bb), bVar2) {
          local_108 = (Instruction *)
                      __gnu_cxx::
                      __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                      ::operator*(&__end4_1);
          pBVar8 = std::
                   unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ::operator->((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                 *)local_108);
          BasicBlock::SetParent(pBVar8,func);
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
          ::operator++(&__end4_1);
        }
        _i = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58,
                        (UptrVector *)&bi.iterator_);
        _local_58 = _i;
        for (local_128._8_8_ =
                  (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   )0x0; (ulong)local_128._8_8_ < (Instruction *)(sVar5 - 1);
            local_128._8_8_ = local_128._8_8_ + 1) {
          UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58);
        }
        new_blks.
        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = true;
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58);
        BasicBlock::begin((BasicBlock *)local_128);
        InstructionList::iterator::operator=((iterator *)(local_78 + 8),(iterator *)local_128);
        pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)(local_78 + 8));
        OVar3 = Instruction::opcode(pIVar4);
        if (OVar3 == OpPhi) {
LAB_003b3a22:
          InstructionList::iterator::operator++((iterator *)(local_78 + 8));
        }
        else {
          pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator->
                             ((iterator_template<spvtools::opt::Instruction> *)(local_78 + 8));
          OVar3 = Instruction::opcode(pIVar4);
          if (OVar3 == OpCopyObject) goto LAB_003b3a22;
        }
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::clear((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 *)&bi.iterator_);
      }
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_58);
  } while( true );
}

Assistant:

bool InstrumentPass::InstrumentFunction(Function* func, uint32_t stage_idx,
                                        InstProcessFunction& pfn) {
  curr_func_ = func;
  call2id_.clear();
  bool first_block_split = false;
  bool modified = false;
  // Apply instrumentation function to each instruction.
  // Using block iterators here because of block erasures and insertions.
  std::vector<std::unique_ptr<BasicBlock>> new_blks;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end();) {
      // Split all executable instructions out of first block into a following
      // block. This will allow function calls to be inserted into the first
      // block without interfering with the instrumentation algorithm.
      if (opt_direct_reads_ && !first_block_split) {
        if (ii->opcode() != spv::Op::OpVariable) {
          SplitBlock(ii, bi, &new_blks);
          first_block_split = true;
        }
      } else {
        pfn(ii, bi, stage_idx, &new_blks);
      }
      // If no new code, continue
      if (new_blks.size() == 0) {
        ++ii;
        continue;
      }
      // Add new blocks to label id map
      for (auto& blk : new_blks) id2block_[blk->id()] = &*blk;
      // If there are new blocks we know there will always be two or
      // more, so update succeeding phis with label of new last block.
      size_t newBlocksSize = new_blks.size();
      assert(newBlocksSize > 1);
      UpdateSucceedingPhis(new_blks);
      // Replace original block with new block(s)
      bi = bi.Erase();
      for (auto& bb : new_blks) {
        bb->SetParent(func);
      }
      bi = bi.InsertBefore(&new_blks);
      // Reset block iterator to last new block
      for (size_t i = 0; i < newBlocksSize - 1; i++) ++bi;
      modified = true;
      // Restart instrumenting at beginning of last new block,
      // but skip over any new phi or copy instruction.
      ii = bi->begin();
      if (ii->opcode() == spv::Op::OpPhi ||
          ii->opcode() == spv::Op::OpCopyObject)
        ++ii;
      new_blks.clear();
    }
  }
  return modified;
}